

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStepInnerStepper_Reset(MRIStepInnerStepper stepper,realtype tR,N_Vector yR)

{
  undefined4 uVar1;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = -0x16;
  }
  else if (*(long *)(in_RDI + 8) == 0) {
    local_4 = -0x16;
  }
  else if (*(long *)(*(long *)(in_RDI + 8) + 0x10) == 0) {
    local_4 = 0;
  }
  else {
    uVar1 = (**(code **)(*(long *)(in_RDI + 8) + 0x10))(in_XMM0_Qa,in_RDI,in_RSI);
    *(undefined4 *)(in_RDI + 0x24) = uVar1;
    local_4 = *(int *)(in_RDI + 0x24);
  }
  return local_4;
}

Assistant:

int mriStepInnerStepper_Reset(MRIStepInnerStepper stepper,
                              realtype tR, N_Vector yR)
{
  if (stepper == NULL) return ARK_ILL_INPUT;
  if (stepper->ops == NULL) return ARK_ILL_INPUT;

  if (stepper->ops->reset) {
    stepper->last_flag = stepper->ops->reset(stepper, tR, yR);
    return stepper->last_flag;
  } else {
    /* assume stepper uses input state and does not need to be reset */
    return ARK_SUCCESS;
  }
}